

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

type absl::lts_20250127::hash_internal::
     AbslHashValue<absl::lts_20250127::hash_internal::MixingHashState,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>
               (MixingHashState hash_state,ErrorLocation e)

{
  MixingHashState MVar1;
  ErrorLocation local_2c;
  uint64_t local_28;
  ErrorLocation local_1c;
  MixingHashState MStack_18;
  ErrorLocation e_local;
  MixingHashState hash_state_local;
  
  local_2c = e;
  local_28 = hash_state.state_;
  local_1c = e;
  MStack_18.state_ = hash_state.state_;
  MVar1 = HashStateBase<absl::lts_20250127::hash_internal::MixingHashState>::combine<unsigned_int>
                    (hash_state,&local_2c);
  return (type)MVar1.state_;
}

Assistant:

typename std::enable_if<std::is_enum<Enum>::value, H>::type AbslHashValue(
    H hash_state, Enum e) {
  // In practice, we could almost certainly just invoke hash_bytes directly,
  // but it's possible that a sanitizer might one day want to
  // store data in the unused bits of an enum. To avoid that risk, we
  // convert to the underlying type before hashing. Hopefully this will get
  // optimized away; if not, we can reopen discussion with c-toolchain-team.
  return H::combine(std::move(hash_state),
                    static_cast<typename std::underlying_type<Enum>::type>(e));
}